

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O3

void VW_Finish_Passes(VW_HANDLE handle)

{
  vw *pointer;
  
  if (1 < *(ulong *)((long)handle + 0x348)) {
    adjust_used_index((vw *)handle);
    *(undefined1 *)((long)handle + 0x3456) = 1;
    VW::start_parser((vw *)handle);
    LEARNER::generic_driver((vw *)handle);
    VW::end_parser((vw *)handle);
    return;
  }
  return;
}

Assistant:

VW_DLL_MEMBER void      VW_CALLING_CONV VW_Finish_Passes(VW_HANDLE handle)
{ vw * pointer = static_cast<vw*>(handle);
  if (pointer->numpasses > 1)
  { adjust_used_index(*pointer);
    pointer->do_reset_source = true;
    VW::start_parser(*pointer);
    LEARNER::generic_driver(*pointer);
    VW::end_parser(*pointer);
  }
}